

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,IVec4 *color,int x,int y,int z)

{
  ChannelType type;
  undefined1 uVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  TextureSwizzle *pTVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint *dst;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  ChannelOrder order;
  ulong uVar12;
  bool bVar13;
  
  dst = (uint *)((long)(this->super_ConstPixelBufferAccess).m_data +
                (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
                (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  switch(type) {
  case UNORM_INT8:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
    switch(order) {
    case RGB:
    case sRGB:
      iVar6 = color->m_data[0];
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      uVar1 = 0;
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)dst = uVar2;
      iVar6 = color->m_data[1];
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 1) = uVar2;
      iVar6 = 0xff;
      if (color->m_data[2] < 0xff) {
        iVar6 = color->m_data[2];
      }
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 2) = uVar2;
      break;
    case RGBA:
    case sRGBA:
      iVar6 = color->m_data[0];
      if (0xfe < color->m_data[0]) {
        iVar6 = 0xff;
      }
      uVar1 = 0;
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)dst = uVar2;
      iVar6 = color->m_data[1];
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 1) = uVar2;
      iVar6 = color->m_data[2];
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 2) = uVar2;
      iVar6 = 0xff;
      if (color->m_data[3] < 0xff) {
        iVar6 = color->m_data[3];
      }
      uVar2 = (char)iVar6;
      if (iVar6 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 3) = uVar2;
      break;
    default:
      goto switchD_008f6aae_caseD_9;
    }
    break;
  default:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
switchD_008f6aae_caseD_9:
    uVar3 = getNumUsedChannels(order);
    pTVar5 = getChannelWriteSwizzle(order);
    if (uVar3 != 0) {
      uVar4 = getChannelSize(type);
      uVar12 = 0;
      do {
        anon_unknown_74::intToChannel
                  ((deUint8 *)dst,color->m_data[(int)pTVar5->components[uVar12]],
                   (this->super_ConstPixelBufferAccess).m_format.type);
        uVar12 = uVar12 + 1;
        dst = (uint *)((long)dst + (ulong)uVar4);
      } while (uVar3 != uVar12);
    }
    break;
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    uVar3 = color->m_data[0];
    if (0xe < uVar3) {
      uVar3 = 0xf;
    }
    uVar4 = 0xf;
    if ((uint)color->m_data[1] < 0xf) {
      uVar4 = color->m_data[1];
    }
    *(byte *)dst = (byte)uVar4 | (byte)(uVar3 << 4);
    break;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    uVar3 = color->m_data[(ulong)!bVar13 * 2];
    if (0x1e < uVar3) {
      uVar3 = 0x1f;
    }
    uVar10 = (ushort)(uVar3 << 0xb);
    uVar3 = 0x3f;
    if ((uint)color->m_data[1] < 0x3f) {
      uVar3 = color->m_data[1];
    }
    uVar4 = 0x1f;
    if ((uint)color->m_data[(ulong)bVar13 * 2] < 0x1f) {
      uVar4 = color->m_data[(ulong)bVar13 * 2];
    }
    uVar9 = (ushort)uVar4 | (ushort)(uVar3 << 5);
    goto LAB_008f6a80;
  case UNORM_SHORT_555:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    uVar3 = color->m_data[(ulong)!bVar13 * 2];
    uVar4 = color->m_data[1];
    if (0x1e < uVar3) {
      uVar3 = 0x1f;
    }
    uVar10 = (ushort)(uVar3 << 10);
    if (0x1e < uVar4) {
      uVar4 = 0x1f;
    }
    uVar3 = 0x1f;
    if ((uint)color->m_data[(ulong)bVar13 * 2] < 0x1f) {
      uVar3 = color->m_data[(ulong)bVar13 * 2];
    }
    uVar9 = (ushort)uVar3 | (ushort)(uVar4 << 5);
LAB_008f6a80:
    *(ushort *)dst = uVar9 | uVar10;
    break;
  case UNORM_SHORT_4444:
  case UNSIGNED_SHORT_4444:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    uVar3 = color->m_data[(ulong)!bVar13 * 2];
    uVar4 = color->m_data[(ulong)bVar13 * 2];
    uVar7 = color->m_data[1];
    if (0xe < uVar3) {
      uVar3 = 0xf;
    }
    if (0xe < uVar7) {
      uVar7 = 0xf;
    }
    if (0xe < uVar4) {
      uVar4 = 0xf;
    }
    uVar11 = 0xf;
    if ((uint)color->m_data[3] < 0xf) {
      uVar11 = color->m_data[3];
    }
    uVar10 = (ushort)uVar11 | (ushort)(uVar4 << 4) | (ushort)(uVar7 << 8) | (ushort)(uVar3 << 0xc);
    goto LAB_008f6a1d;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    uVar3 = color->m_data[(ulong)!bVar13 * 2];
    uVar4 = color->m_data[1];
    if (0x1e < uVar3) {
      uVar3 = 0x1f;
    }
    if (0x1e < uVar4) {
      uVar4 = 0x1f;
    }
    uVar7 = 0x1f;
    if ((uint)color->m_data[(ulong)bVar13 * 2] < 0x1f) {
      uVar7 = color->m_data[(ulong)bVar13 * 2];
    }
    *(ushort *)dst =
         (ushort)(color->m_data[3] != 0) |
         ((ushort)(uVar4 << 6) | (ushort)(uVar3 << 0xb)) + (short)uVar7 * 2;
    break;
  case UNORM_SHORT_1555:
    uVar3 = color->m_data[0];
    uVar4 = color->m_data[1];
    if (0x1e < uVar3) {
      uVar3 = 0x1f;
    }
    if (0x1e < uVar4) {
      uVar4 = 0x1f;
    }
    uVar7 = 0x1f;
    if ((uint)color->m_data[2] < 0x1f) {
      uVar7 = color->m_data[2];
    }
    uVar10 = (ushort)uVar7 | (ushort)(uVar4 << 5) |
             (ushort)(uVar3 << 10) | (ushort)(color->m_data[3] != 0) << 0xf;
LAB_008f6a1d:
    *(ushort *)dst = uVar10;
    break;
  case UNORM_INT_101010:
    uVar3 = color->m_data[0];
    uVar4 = color->m_data[1];
    if (0x3fe < uVar3) {
      uVar3 = 0x3ff;
    }
    if (0x3fe < uVar4) {
      uVar4 = 0x3ff;
    }
    uVar7 = 0x3ff;
    if ((uint)color->m_data[2] < 0x3ff) {
      uVar7 = color->m_data[2];
    }
    uVar3 = (uVar4 << 0xc | uVar3 << 0x16) + uVar7 * 4;
    goto LAB_008f6a49;
  case SNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    uVar3 = color->m_data[1];
    uVar4 = color->m_data[(ulong)!bVar13 * 2];
    if (0x1fe < color->m_data[(ulong)!bVar13 * 2]) {
      uVar4 = 0x1ff;
    }
    if ((int)uVar4 < -0x1ff) {
      uVar4 = 0xfffffe00;
    }
    if (0x1fe < (int)uVar3) {
      uVar3 = 0x1ff;
    }
    if ((int)uVar3 < -0x1ff) {
      uVar3 = 0xfffffe00;
    }
    uVar7 = 0x1ff;
    if (color->m_data[(ulong)bVar13 * 2] < 0x1ff) {
      uVar7 = color->m_data[(ulong)bVar13 * 2];
    }
    if ((int)uVar7 < -0x1ff) {
      uVar7 = 0xfffffe00;
    }
    iVar6 = 1;
    if (color->m_data[3] < 1) {
      iVar6 = color->m_data[3];
    }
    iVar8 = -2;
    if (-2 < iVar6) {
      iVar8 = iVar6;
    }
    *dst = iVar8 << 0x1e | (uVar7 & 0x3ff) << 0x14 | (uVar3 & 0x3ff) << 10 | uVar4 & 0x3ff;
    break;
  case UNORM_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    bVar13 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    uVar3 = color->m_data[(ulong)!bVar13 * 2];
    if (0x3fe < (uint)color->m_data[(ulong)!bVar13 * 2]) {
      uVar3 = 0x3ff;
    }
    uVar4 = color->m_data[1];
    if (0x3fe < (uint)color->m_data[1]) {
      uVar4 = 0x3ff;
    }
    uVar7 = 0x3ff;
    if ((uint)color->m_data[(ulong)bVar13 * 2] < 0x3ff) {
      uVar7 = color->m_data[(ulong)bVar13 * 2];
    }
    uVar11 = 3;
    if ((uint)color->m_data[3] < 3) {
      uVar11 = color->m_data[3];
    }
    uVar3 = uVar11 << 0x1e | uVar7 << 0x14 | uVar4 << 10 | uVar3;
LAB_008f6a49:
    *dst = uVar3;
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const IVec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Int(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Int(pixelPtr, color);
			return;
		}
	}

#define PU(VAL, OFFS, BITS)		(uintToChannel((deUint32)(VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((deUint32)(VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:	// Fall-through
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8 )(PU(color[0],  4, 4) | PU(color[1], 0, 4));				break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PU(color[0], 22, 10) | PU(color[1], 12, 10) | PU(color[2], 2, 10);	break;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 10, 5) | PU(swizzled[1], 5, 5) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const IVec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 15, 1) | PU(swizzled[1], 10, 5) | PU(swizzled[2], 5, 5) | PU(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(swizzled[0],  0, 10) | PU(swizzled[1], 10, 10) | PU(swizzled[2], 20, 10) | PU(swizzled[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(swizzled[0],  0, 10) | PI(swizzled[1], 10, 10) | PI(swizzled[2], 20, 10) | PI(swizzled[3], 30, 2);
			break;
		}

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				intToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PU
#undef PI
}